

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t flatcc_builder_create_string(flatcc_builder_t *B,char *s,size_t len)

{
  flatcc_builder_ref_t fVar1;
  ulong uVar2;
  long lVar3;
  flatcc_iov_state_t iov;
  flatbuffers_uoffset_t length_prefix;
  flatcc_iov_state_t local_90;
  
  fVar1 = 0;
  if (len >> 0x20 == 0) {
    local_90.iov[0].iov_base = &length_prefix;
    length_prefix = (flatbuffers_uoffset_t)len;
    local_90.iov[0].iov_len = 4;
    if (len == 0) {
      lVar3 = 4;
      local_90.count = 1;
    }
    else {
      lVar3 = len + 4;
      local_90.count = 2;
      local_90.iov[1].iov_base = s;
      local_90.iov[1].iov_len = len;
    }
    uVar2 = (ulong)((~length_prefix + B->emit_start & 3) + 1);
    local_90.len = lVar3 + uVar2;
    *(uint8_t **)((long)&local_90.iov[0].iov_base + (ulong)(uint)(local_90.count << 4)) = "";
    *(ulong *)((long)&local_90.iov[0].iov_len + (ulong)(uint)(local_90.count << 4)) = uVar2;
    local_90.count = local_90.count + 1;
    fVar1 = emit_front(B,&local_90);
  }
  return fVar1;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_string(flatcc_builder_t *B, const char *s, size_t len)
{
    uoffset_t s_pad;
    uoffset_t length_prefix;
    iov_state_t iov;

    if (len > max_string_len) {
        return 0;
    }
    write_uoffset(&length_prefix, (uoffset_t)len);
    /* Add 1 for zero termination. */
    s_pad = front_pad(B, (uoffset_t)len + 1, field_size) + 1;
    init_iov();
    push_iov(&length_prefix, field_size);
    push_iov(s, len);
    push_iov(_pad, s_pad);
    return emit_front(B, &iov);
}